

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall
spectest::JSONParser::ParseExpectedValue
          (JSONParser *this,ExpectedValue *out_value,AllowExpected allow_expected)

{
  string_view sVar1;
  Type TVar2;
  bool bVar3;
  Result RVar4;
  Enum EVar5;
  int iVar6;
  int local_90;
  int lane;
  int lane_count;
  Type local_6c;
  Type lane_type;
  undefined1 local_50 [8];
  string value_str;
  Type type;
  AllowExpected allow_expected_local;
  ExpectedValue *out_value_local;
  JSONParser *this_local;
  
  std::__cxx11::string::string((string *)local_50);
  RVar4 = Expect(this,"{");
  bVar3 = wabt::Failed(RVar4);
  if (bVar3) {
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar4 = ExpectKey(this,"type");
    bVar3 = wabt::Failed(RVar4);
    if (bVar3) {
      wabt::Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      lane_type.type_index_ = (Index)ParseType(this,(Type *)((long)&value_str.field_2 + 0xc));
      bVar3 = wabt::Failed((Result)lane_type.type_index_);
      if (bVar3) {
        wabt::Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        lane_type.enum_ = (Enum)Expect(this,",");
        bVar3 = wabt::Failed((Result)lane_type.enum_);
        if (bVar3) {
          wabt::Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          EVar5 = wabt::Type::operator_cast_to_Enum((Type *)((long)&value_str.field_2 + 0xc));
          if (EVar5 == V128) {
            RVar4 = ExpectKey(this,"lane_type");
            bVar3 = wabt::Failed(RVar4);
            if (bVar3) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              goto LAB_00138005;
            }
            RVar4 = ParseType(this,&local_6c);
            bVar3 = wabt::Failed(RVar4);
            if (bVar3) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              goto LAB_00138005;
            }
            RVar4 = Expect(this,",");
            bVar3 = wabt::Failed(RVar4);
            if (bVar3) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              goto LAB_00138005;
            }
            RVar4 = ExpectKey(this,"value");
            bVar3 = wabt::Failed(RVar4);
            if (bVar3) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              goto LAB_00138005;
            }
            RVar4 = Expect(this,"[");
            bVar3 = wabt::Failed(RVar4);
            if (bVar3) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              goto LAB_00138005;
            }
            iVar6 = LaneCountFromType(local_6c);
            for (local_90 = 0; local_90 < iVar6; local_90 = local_90 + 1) {
              RVar4 = ParseString(this,(string *)local_50);
              bVar3 = wabt::Failed(RVar4);
              TVar2 = local_6c;
              if (bVar3) {
                wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                goto LAB_00138005;
              }
              sVar1 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
              RVar4 = ParseLaneConstValue(this,TVar2,local_90,out_value,sVar1,allow_expected);
              bVar3 = wabt::Failed(RVar4);
              if (bVar3) {
                wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                goto LAB_00138005;
              }
              if (local_90 < iVar6 + -1) {
                RVar4 = Expect(this,",");
                bVar3 = wabt::Failed(RVar4);
                if (bVar3) {
                  wabt::Result::Result((Result *)((long)&this_local + 4),Error);
                  goto LAB_00138005;
                }
              }
            }
            RVar4 = Expect(this,"]");
            bVar3 = wabt::Failed(RVar4);
            if (bVar3) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              goto LAB_00138005;
            }
            (out_value->value).type = stack0xffffffffffffffd4;
            out_value->lane_type = local_6c;
          }
          else {
            RVar4 = ParseKeyStringValue(this,"value",(string *)local_50);
            bVar3 = wabt::Failed(RVar4);
            TVar2 = stack0xffffffffffffffd4;
            if (bVar3) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              goto LAB_00138005;
            }
            sVar1 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
            RVar4 = ParseConstValue(this,TVar2,&(out_value->value).value,out_value->nan,sVar1,
                                    allow_expected);
            bVar3 = wabt::Failed(RVar4);
            if (bVar3) {
              wabt::Result::Result((Result *)((long)&this_local + 4),Error);
              goto LAB_00138005;
            }
            (out_value->value).type = stack0xffffffffffffffd4;
          }
          RVar4 = Expect(this,"}");
          bVar3 = wabt::Failed(RVar4);
          if (bVar3) {
            wabt::Result::Result((Result *)((long)&this_local + 4),Error);
          }
          else {
            wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
          }
        }
      }
    }
  }
LAB_00138005:
  std::__cxx11::string::~string((string *)local_50);
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result JSONParser::ParseExpectedValue(ExpectedValue* out_value,
                                            AllowExpected allow_expected) {
  Type type;
  std::string value_str;
  EXPECT("{");
  EXPECT_KEY("type");
  CHECK_RESULT(ParseType(&type));
  EXPECT(",");
  if (type == Type::V128) {
    Type lane_type;
    EXPECT_KEY("lane_type");
    CHECK_RESULT(ParseType(&lane_type));
    EXPECT(",");
    EXPECT_KEY("value");
    EXPECT("[");

    int lane_count = LaneCountFromType(lane_type);
    for (int lane = 0; lane < lane_count; ++lane) {
      CHECK_RESULT(ParseString(&value_str));
      CHECK_RESULT(ParseLaneConstValue(lane_type, lane, out_value, value_str,
                                       allow_expected));
      if (lane < lane_count - 1) {
        EXPECT(",");
      }
    }
    EXPECT("]");
    out_value->value.type = type;
    out_value->lane_type = lane_type;
  } else {
    PARSE_KEY_STRING_VALUE("value", &value_str);
    CHECK_RESULT(ParseConstValue(type, &out_value->value.value,
                                 &out_value->nan[0], value_str,
                                 allow_expected));
    out_value->value.type = type;
  }
  EXPECT("}");

  return wabt::Result::Ok;
}